

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O1

uint8_t __thiscall Samba::readByte(Samba *this,uint32_t addr)

{
  SerialPort *pSVar1;
  int iVar2;
  undefined8 *puVar3;
  uint8_t cmd [13];
  byte local_2d [13];
  
  snprintf((char *)local_2d,0xd,"o%08X,4#",addr);
  pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
           _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
           super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
  iVar2 = (*pSVar1->_vptr_SerialPort[6])(pSVar1,local_2d,0xc);
  if (iVar2 == 0xc) {
    pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
             _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
             super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
    iVar2 = (*pSVar1->_vptr_SerialPort[5])(pSVar1,local_2d,1);
    if (iVar2 == 1) {
      if (this->_debug == true) {
        printf("%s(addr=%#x)=%#x\n","readByte",addr,(ulong)local_2d[0]);
      }
      return local_2d[0];
    }
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = &PTR__exception_001195a0;
  __cxa_throw(puVar3,&SambaError::typeinfo,std::exception::~exception);
}

Assistant:

uint8_t
Samba::readByte(uint32_t addr)
{
    uint8_t cmd[13];
    uint8_t value;

    snprintf((char*) cmd, sizeof(cmd), "o%08X,4#", addr);
    if (_port->write(cmd, sizeof(cmd) - 1) != sizeof(cmd) - 1)
        throw SambaError();
    if (_port->read(cmd, sizeof(uint8_t)) != sizeof(uint8_t))
        throw SambaError();

    value = cmd[0];

    if (_debug)
        printf("%s(addr=%#x)=%#x\n", __FUNCTION__, addr, value);

    return value;
}